

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.cc
# Opt level: O2

DVector * __thiscall fizplex::DVector::operator-=(DVector *this,DVector *rhs)

{
  size_t sVar1;
  double *pdVar2;
  size_t *psVar3;
  double *pdVar4;
  size_t i;
  ulong i_00;
  
  sVar1 = this->dim;
  psVar3 = dimension(rhs);
  if (sVar1 == *psVar3) {
    for (i_00 = 0; i_00 < this->dim; i_00 = i_00 + 1) {
      pdVar4 = operator[](rhs,i_00);
      pdVar2 = (this->vals)._M_data;
      pdVar2[i_00] = pdVar2[i_00] - *pdVar4;
    }
    return this;
  }
  __assert_fail("dim == rhs.dimension()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/dvector.cc"
                ,0x5f,"DVector &fizplex::DVector::operator-=(const DVector &)");
}

Assistant:

DVector &DVector::operator-=(const DVector &rhs) {
  assert(dim == rhs.dimension());
  for (size_t i = 0; i < dim; i++)
    vals[i] -= rhs[i];
  return *this;
}